

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

int Lpk_NodeCutsOneFilter(Lpk_Cut_t *pCuts,int nCuts,Lpk_Cut_t *pCutNew)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  Lpk_Cut_t *pCut;
  ulong uVar8;
  
  if ((pCutNew->uSign[0] == 0) && (pCutNew->uSign[1] == 0)) {
    __assert_fail("pCutNew->uSign[0] || pCutNew->uSign[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkCut.c"
                  ,0x16e,"int Lpk_NodeCutsOneFilter(Lpk_Cut_t *, int, Lpk_Cut_t *)");
  }
  uVar7 = (ulong)(uint)nCuts;
  if (nCuts < 1) {
    uVar7 = 0;
  }
  piVar5 = pCuts->pLeaves;
  uVar8 = 0;
  do {
    if (uVar8 == uVar7) {
      return 0;
    }
    uVar1 = *(uint *)(pCuts + uVar8);
    uVar2 = uVar1 & 0x3f;
    if (uVar2 != 0) {
      pCut = pCuts + uVar8;
      if (uVar2 == (*(uint *)pCutNew & 0x3f)) {
        if ((pCut->uSign[0] == pCutNew->uSign[0]) && (pCut->uSign[1] == pCutNew->uSign[1])) {
          uVar4 = 0;
          while( true ) {
            if (uVar2 == uVar4) {
              return 1;
            }
            if (piVar5[uVar4] != pCutNew->pLeaves[uVar4]) break;
            uVar4 = uVar4 + 1;
          }
          if (uVar2 == (uint)uVar4) {
            return 1;
          }
        }
      }
      else {
        uVar6 = pCutNew->uSign[0] & pCut->uSign[0];
        if (uVar2 < (*(uint *)pCutNew & 0x3f)) {
          if (((uVar6 == pCut->uSign[0]) && ((pCut->uSign[1] & ~pCutNew->uSign[1]) == 0)) &&
             (iVar3 = Lpk_NodeCutsOneDominance(pCut,pCutNew), iVar3 != 0)) {
            return 1;
          }
        }
        else if (((uVar6 == pCutNew->uSign[0]) && ((pCutNew->uSign[1] & ~pCut->uSign[1]) == 0)) &&
                (iVar3 = Lpk_NodeCutsOneDominance(pCutNew,pCut), iVar3 != 0)) {
          *(uint *)pCut = uVar1 & 0xffffffc0;
        }
      }
    }
    uVar8 = uVar8 + 1;
    piVar5 = piVar5 + 0xcd;
  } while( true );
}

Assistant:

int Lpk_NodeCutsOneFilter( Lpk_Cut_t * pCuts, int nCuts, Lpk_Cut_t * pCutNew )
{
    Lpk_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uSign[0] || pCutNew->uSign[1] );
    // try to find the cut
    for ( i = 0; i < nCuts; i++ )
    {
        pCut = pCuts + i;
        if ( pCut->nLeaves == 0 )
            continue;
        if ( pCut->nLeaves == pCutNew->nLeaves )
        {
            if ( pCut->uSign[0] == pCutNew->uSign[0] && pCut->uSign[1] == pCutNew->uSign[1] )
            {
                for ( k = 0; k < (int)pCutNew->nLeaves; k++ )
                    if ( pCut->pLeaves[k] != pCutNew->pLeaves[k] )
                        break;
                if ( k == (int)pCutNew->nLeaves )
                    return 1;
            }
            continue;
        }
        if ( pCut->nLeaves < pCutNew->nLeaves )
        {
            // skip the non-contained cuts
            if ( (pCut->uSign[0] & pCutNew->uSign[0]) != pCut->uSign[0] )
                continue;
            if ( (pCut->uSign[1] & pCutNew->uSign[1]) != pCut->uSign[1] )
                continue;
            // check containment seriously
            if ( Lpk_NodeCutsOneDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uSign[0] & pCutNew->uSign[0]) != pCutNew->uSign[0] )
            continue;
        if ( (pCut->uSign[1] & pCutNew->uSign[1]) != pCutNew->uSign[1] )
            continue;
        // check containment seriously
        if ( Lpk_NodeCutsOneDominance( pCutNew, pCut ) )
            pCut->nLeaves = 0; // removed
    }
    return 0;
}